

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O2

bool QMetaType::hasRegisteredConverterFunction(QMetaType fromType,QMetaType toType)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Type *this;
  pair<int,_int> k;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
  *in_RDI;
  long in_FS_OFFSET;
  QMetaType local_30;
  QMetaType local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
         ::operator()(in_RDI);
  iVar2 = registerHelper(&local_28);
  iVar3 = registerHelper(&local_30);
  k.second = iVar3;
  k.first = iVar2;
  bVar1 = QMetaTypeFunctionRegistry<std::function<bool_(const_void_*,_void_*)>,_std::pair<int,_int>_>
          ::contains(this,k);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QMetaType::hasRegisteredConverterFunction(QMetaType fromType, QMetaType toType)
{
    return customTypesConversionRegistry()->contains({fromType.id(), toType.id()});
}